

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.cpp
# Opt level: O1

int str_upper(lua_State *L)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  size_t l;
  luaL_Buffer b;
  ulong local_2040;
  luaL_Buffer local_2038;
  
  pcVar3 = luaL_checklstring(L,1,&local_2040);
  luaL_buffinit(L,&local_2038);
  if (local_2040 != 0) {
    uVar4 = 0;
    do {
      if (&stack0xffffffffffffffe0 <= local_2038.p) {
        luaL_prepbuffer(&local_2038);
      }
      iVar2 = toupper((uint)(byte)pcVar3[uVar4]);
      pcVar1 = local_2038.p + 1;
      *local_2038.p = (char)iVar2;
      uVar4 = uVar4 + 1;
      local_2038.p = pcVar1;
    } while (uVar4 < local_2040);
  }
  luaL_pushresult(&local_2038);
  return 1;
}

Assistant:

static int str_upper (lua_State *L) {
  size_t l;
  size_t i;
  luaL_Buffer b;
  const char *s = luaL_checklstring(L, 1, &l);
  luaL_buffinit(L, &b);
  for (i=0; i<l; i++)
    luaL_addchar(&b, toupper(uchar(s[i])));
  luaL_pushresult(&b);
  return 1;
}